

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O2

void __thiscall Transporter::Send(Transporter *this,uv_stream_t *handler,char *data,size_t len)

{
  void *__s;
  char *base;
  uv_async_t *handle;
  uv_buf_t uVar1;
  
  if (this->connected == true) {
    __s = operator_new(0xd8);
    memset(__s,0,0xd8);
    base = (char *)malloc(len);
    memcpy(base,data,len);
    uVar1 = uv_buf_init(base,(uint)len);
    *(uv_buf_t *)((long)__s + 0xc0) = uVar1;
    *(uv_stream_t **)((long)__s + 0xd0) = handler;
    handle = (uv_async_t *)operator_new(0x80);
    handle->data = __s;
    uv_async_init(this->loop,handle,async_write);
    uv_async_send(handle);
    return;
  }
  return;
}

Assistant:

void Transporter::Send(uv_stream_t* handler, const char* data, size_t len)
{
	if (!IsConnected())
	{
		return;
	}
	auto* writeReq = new write_req_t();
	char* newData = static_cast<char*>(malloc(len));

	memcpy(newData, data, len);
	writeReq->buf = uv_buf_init(newData, len);
	writeReq->handler = handler;

	// thread safe:
	auto* async = new uv_async_t;
	async->data = writeReq;
	uv_async_init(loop, async, async_write);
	uv_async_send(async);
}